

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::createInstance
          (BeagleCPUImpl<float,_1,_0> *this,int tipCount,int partialsBufferCount,
          int compactBufferCount,int stateCount,int patternCount,int eigenDecompositionCount,
          int matrixCount,int categoryCount,int scaleBufferCount,int resourceNumber,
          int pluginResourceNumber,long preferenceFlags,long requirementFlags)

{
  float **ppfVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  EigenDecompositionSquare<float,_1> *this_00;
  double **ppdVar6;
  double *pdVar7;
  float **ppfVar8;
  int **ppiVar9;
  float *pfVar10;
  undefined8 *puVar11;
  float *pfVar12;
  void *pvVar13;
  int *piVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  int i_1;
  ulong uVar19;
  int i;
  uint uVar20;
  ulong uVar21;
  size_t sVar22;
  ulong uVar23;
  uint local_38;
  
  this->realtypeMin = 1.1754944e-38;
  this->scalingExponentThreshold = 0x14;
  *(int *)&(this->super_BeagleImpl).field_0xc = partialsBufferCount + compactBufferCount;
  this->kTipCount = tipCount;
  this->kStateCount = stateCount;
  this->kPatternCount = patternCount;
  this->kPartitionCount = 1;
  this->kMaxPartitionCount = 1;
  this->kPartitionsInitialised = false;
  this->kPatternsReordered = false;
  this->kInternalPartialsBufferCount = (partialsBufferCount + compactBufferCount) - tipCount;
  this->kTransPaddedStateCount = stateCount + 1;
  this->kPartialsPaddedStateCount = stateCount;
  iVar3 = (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x5c])();
  iVar4 = this->kStateCount;
  iVar16 = this->kPatternCount % iVar3;
  iVar3 = iVar3 - iVar16;
  if (iVar16 == 0) {
    iVar3 = 0;
  }
  uVar21 = requirementFlags | preferenceFlags;
  uVar17 = this->kPatternCount + iVar3;
  this->kPaddedPatternCount = uVar17;
  this->kExtraPatterns = iVar3;
  this->kMatrixCount = matrixCount;
  this->kEigenDecompCount = eigenDecompositionCount;
  this->kCategoryCount = categoryCount;
  this->kScaleBufferCount = scaleBufferCount;
  this->kMatrixSize = (iVar4 + 1) * iVar4;
  this->kFlags = 0;
  uVar20 = (uint)uVar21;
  if ((char)uVar21 < '\0') {
    this->kFlags = 0x480;
    this->kScaleBufferCount = this->kInternalPartialsBufferCount;
    lVar5 = 0x480;
  }
  else if ((uVar20 >> 8 & 1) == 0) {
    if ((uVar20 >> 0x19 & 1) == 0) {
      if ((uVar20 >> 10 & 1) == 0) {
        lVar5 = 0x240;
        this->kFlags = 0x240;
      }
      else {
        this->kFlags = 0x440;
        lVar5 = 0x440;
      }
    }
    else {
      this->kFlags = 0x2000200;
      lVar5 = 0x2000200;
    }
  }
  else {
    this->kFlags = 0x500;
    this->kScaleBufferCount = this->kInternalPartialsBufferCount + 1;
    lVar5 = 0x500;
  }
  uVar18 = 0x40000000;
  if ((uVar20 >> 0x1e & 1) == 0) {
    uVar18 = 0x4000;
  }
  lVar5 = (ulong)(((uVar20 & 0x20) >> 5) << 4) + lVar5 + 0x100010 +
          (uVar18 | (uint)(uVar21 >> 1) & 0x100000);
  this->kFlags = lVar5;
  if ((uVar21 & 0x20) == 0) {
    this_00 = (EigenDecompositionSquare<float,_1> *)operator_new(0x48);
    EigenDecompositionCube<float,_1>::EigenDecompositionCube
              ((EigenDecompositionCube<float,_1> *)this_00,eigenDecompositionCount,iVar4,
               categoryCount,lVar5);
  }
  else {
    this_00 = (EigenDecompositionSquare<float,_1> *)operator_new(0x58);
    EigenDecompositionSquare<float,_1>::EigenDecompositionSquare
              (this_00,eigenDecompositionCount,iVar4,categoryCount,lVar5);
  }
  this->gEigenDecomposition = &this_00->super_EigenDecomposition<float,_1>;
  sVar22 = (size_t)this->kEigenDecompCount;
  ppdVar6 = (double **)calloc(8,sVar22);
  this->gCategoryRates = ppdVar6;
  if (ppdVar6 != (double **)0x0) {
    pdVar7 = (double *)malloc((long)this->kPatternCount << 3);
    this->gPatternWeights = pdVar7;
    if (pdVar7 != (double *)0x0) {
      this->kPartialsSize =
           this->kPartialsPaddedStateCount * this->kPaddedPatternCount * this->kCategoryCount;
      uVar20 = *(uint *)&(this->super_BeagleImpl).field_0xc;
      ppfVar8 = (float **)malloc((long)(int)uVar20 * 8);
      this->gPartials = ppfVar8;
      if (ppfVar8 != (float **)0x0) {
        ppfVar8 = (float **)calloc(8,sVar22);
        this->gStateFrequencies = ppfVar8;
        if (ppfVar8 != (float **)0x0) {
          ppfVar8 = (float **)calloc(8,sVar22);
          this->gCategoryWeights = ppfVar8;
          if (ppfVar8 != (float **)0x0) {
            ppiVar9 = (int **)malloc((long)(int)uVar20 * 8);
            this->gTipStates = ppiVar9;
            if (ppiVar9 != (int **)0x0) {
              for (uVar21 = 0; (~((int)uVar20 >> 0x1f) & uVar20) != uVar21; uVar21 = uVar21 + 1) {
                this->gPartials[uVar21] = (float *)0x0;
                this->gTipStates[uVar21] = (int *)0x0;
              }
              lVar5 = (long)this->kTipCount;
              do {
                if (*(int *)&(this->super_BeagleImpl).field_0xc <= lVar5) {
                  this->gScaleBuffers = (float **)0x0;
                  this->gAutoScaleBuffers = (short **)0x0;
                  uVar20 = this->kScaleBufferCount;
                  lVar5 = this->kFlags;
                  ppfVar8 = (float **)malloc((long)(int)uVar20 * 8);
                  lVar15 = (long)(int)uVar17;
                  if ((char)lVar5 < '\0') {
                    this->gAutoScaleBuffers = (short **)ppfVar8;
                    if (ppfVar8 != (float **)0x0) {
                      uVar21 = 0;
                      goto LAB_0013b931;
                    }
                  }
                  else {
                    this->gScaleBuffers = ppfVar8;
                    if (ppfVar8 != (float **)0x0) {
                      uVar21 = 0;
                      goto LAB_0013b8c2;
                    }
                  }
                  break;
                }
                pfVar10 = (float *)mallocAligned(this,(long)this->kPartialsSize << 2);
                this->gPartials[lVar5] = pfVar10;
                ppfVar8 = this->gPartials + lVar5;
                lVar5 = lVar5 + 1;
              } while (*ppfVar8 != (float *)0x0);
            }
          }
        }
      }
    }
  }
  goto LAB_0013b9ea;
LAB_0013b8c2:
  if (uVar21 == (~((int)uVar20 >> 0x1f) & uVar20)) goto LAB_0013b990;
  pfVar10 = (float *)malloc(lVar15 << 2);
  ppfVar8[uVar21] = pfVar10;
  ppfVar8 = this->gScaleBuffers;
  pfVar10 = ppfVar8[uVar21];
  if (pfVar10 == (float *)0x0) goto LAB_0013b9ea;
  local_38 = (uint)lVar5;
  if ((local_38 >> 0x19 & 1) != 0) {
    for (uVar18 = 0; (~((int)uVar17 >> 0x1f) & uVar17) != uVar18; uVar18 = uVar18 + 1) {
      pfVar10[uVar18] = 1.0;
    }
  }
  uVar21 = uVar21 + 1;
  goto LAB_0013b8c2;
  while( true ) {
    pfVar10 = (float *)malloc(lVar15 * 2);
    ppfVar8[uVar21] = pfVar10;
    ppfVar8 = (float **)this->gAutoScaleBuffers;
    ppfVar1 = ppfVar8 + uVar21;
    uVar21 = uVar21 + 1;
    if (*ppfVar1 == (float *)0x0) break;
LAB_0013b931:
    if ((~((int)uVar20 >> 0x1f) & uVar20) == uVar21) {
      piVar14 = (int *)malloc((long)this->kInternalPartialsBufferCount << 2);
      this->gActiveScalingFactors = piVar14;
      ppfVar8 = (float **)malloc(8);
      this->gScaleBuffers = ppfVar8;
      pfVar10 = (float *)malloc(lVar15 << 2);
      *ppfVar8 = pfVar10;
LAB_0013b990:
      ppfVar8 = (float **)malloc((long)this->kMatrixCount << 3);
      this->gTransitionMatrices = ppfVar8;
      if (ppfVar8 != (float **)0x0) {
        lVar5 = 0;
        do {
          if (this->kMatrixCount <= lVar5) {
            pfVar10 = (float *)mallocAligned(this,(long)this->kStateCount *
                                                  (long)this->kPatternCount * 4);
            this->integrationTmp = pfVar10;
            sVar22 = (long)this->kStateCount * (long)this->kPatternCount * 4;
            pfVar10 = (float *)malloc(sVar22);
            this->firstDerivTmp = pfVar10;
            pfVar10 = (float *)malloc(sVar22);
            this->secondDerivTmp = pfVar10;
            pfVar10 = (float *)mallocAligned(this,(long)this->kPaddedPatternCount << 2);
            this->grandDenominatorDerivTmp = pfVar10;
            pfVar10 = (float *)mallocAligned(this,(long)this->kPaddedPatternCount << 2);
            this->grandNumeratorDerivTmp = pfVar10;
            this->crossProductNumeratorTmp = (float *)0x0;
            sVar22 = (long)this->kStateCount * (long)this->kPatternCount * 4;
            pfVar10 = (float *)malloc(sVar22);
            this->outLogLikelihoodsTmp = pfVar10;
            pfVar10 = (float *)malloc(sVar22);
            this->outFirstDerivativesTmp = pfVar10;
            pfVar10 = (float *)malloc(sVar22);
            this->outSecondDerivativesTmp = pfVar10;
            uVar17 = this->kPaddedPatternCount;
            pfVar10 = (float *)malloc((long)(int)uVar17 << 2);
            this->zeros = pfVar10;
            pfVar12 = (float *)malloc((long)(int)uVar17 << 2);
            this->ones = pfVar12;
            for (uVar21 = 0; (~((int)uVar17 >> 0x1f) & uVar17) != uVar21; uVar21 = uVar21 + 1) {
              pfVar10[uVar21] = 0.0;
              pfVar12[uVar21] = 1.0;
            }
            this->kThreadingEnabled = false;
            this->kAutoPartitioningEnabled = false;
            if ((this->kFlags & 0x40000000) != 0) {
              uVar17 = std::thread::hardware_concurrency();
              if (this->kStateCount < 5) {
                this->kMinPatternCount = 0x100;
                if ((int)uVar17 < 0x10) {
                  this->kMinPatternCount = 0x300;
                  uVar20 = 0x300;
                }
                else {
                  if (this->kPatternCount < 0x40000) {
                    uVar17 = 0x10;
                  }
                  uVar20 = 0x100;
                }
              }
              else {
                this->kMinPatternCount = 2;
                uVar20 = 2;
              }
              uVar2 = this->kPatternCount;
              uVar21 = (ulong)uVar2;
              if (2 < (int)uVar17 && (int)uVar20 <= (int)uVar2) {
                uVar19 = 0;
                uVar18 = (ulong)uVar2 / (ulong)(uVar20 >> 1);
                uVar23 = (ulong)(uVar17 >> 1);
                if ((uint)uVar18 < uVar17 >> 1) {
                  uVar23 = uVar18;
                }
                pvVar13 = malloc(uVar21 * 4);
                for (; uVar21 != uVar19; uVar19 = uVar19 + 1) {
                  iVar4 = (int)((long)((ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 |
                                      uVar19 & 0xffffffff) / (long)(int)(uVar21 / uVar23));
                  if ((int)uVar23 <= iVar4) {
                    iVar4 = (int)uVar23 + -1;
                  }
                  *(int *)((long)pvVar13 + uVar19 * 4) = iVar4;
                }
                (*(this->super_BeagleImpl)._vptr_BeagleImpl[0xe])(this,uVar23,pvVar13);
                piVar14 = (int *)malloc((long)this->kPartitionCount *
                                        (long)*(int *)&(this->super_BeagleImpl).field_0xc * 0x24);
                this->gAutoPartitionOperations = piVar14;
                if (this->kMinPatternCount * 4 <= this->kPatternCount) {
                  piVar14 = (int *)malloc(uVar23 * 4);
                  this->gAutoPartitionIndices = piVar14;
                  for (uVar21 = 0; uVar23 != uVar21; uVar21 = uVar21 + 1) {
                    piVar14[uVar21] = (int)uVar21;
                  }
                  pdVar7 = (double *)malloc(uVar23 << 3);
                  this->gAutoPartitionOutSumLogLikelihoods = pdVar7;
                  this->kAutoRootPartitioningEnabled = false;
                }
                this->kAutoPartitioningEnabled = false;
              }
            }
            return 0;
          }
          pfVar10 = (float *)mallocAligned(this,(long)this->kCategoryCount * (long)this->kMatrixSize
                                                * 4);
          this->gTransitionMatrices[lVar5] = pfVar10;
          ppfVar8 = this->gTransitionMatrices + lVar5;
          lVar5 = lVar5 + 1;
        } while (*ppfVar8 != (float *)0x0);
      }
      break;
    }
  }
LAB_0013b9ea:
  puVar11 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar11 = __cxa_init_primary_exception;
  __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::createInstance(int tipCount,
                                  int partialsBufferCount,
                                  int compactBufferCount,
                                  int stateCount,
                                  int patternCount,
                                  int eigenDecompositionCount,
                                  int matrixCount,
                                  int categoryCount,
                                  int scaleBufferCount,
                                  int resourceNumber,
                                  int pluginResourceNumber,
                                  long preferenceFlags,
                                  long requirementFlags) {
    if (DEBUGGING_OUTPUT)
        std::cerr << "in BeagleCPUImpl::initialize\n" ;

    if (DOUBLE_PRECISION) {
        realtypeMin = DBL_MIN;
        scalingExponentThreshold = 200;
    } else {
        realtypeMin = FLT_MIN;
        scalingExponentThreshold = 20;
    }

    kBufferCount = partialsBufferCount + compactBufferCount;
    kTipCount = tipCount;
    assert(kBufferCount > kTipCount);
    kStateCount = stateCount;
    kPatternCount = patternCount;

    kPartitionCount = 1;
    kMaxPartitionCount = kPartitionCount;
    kPartitionsInitialised = false;
    kPatternsReordered = false;

    kInternalPartialsBufferCount = kBufferCount - kTipCount;

    kTransPaddedStateCount = kStateCount + T_PAD;
    kPartialsPaddedStateCount = kStateCount + P_PAD;

    // Handle possible padding of pattern sites for vectorization
    int modulus = getPaddedPatternsModulus();
    kPaddedPatternCount = kPatternCount;
    int remainder = kPatternCount % modulus;
    if (remainder != 0) {
        kPaddedPatternCount += modulus - remainder;
    }
    kExtraPatterns = kPaddedPatternCount - kPatternCount;

    kMatrixCount = matrixCount;
    kEigenDecompCount = eigenDecompositionCount;
    kCategoryCount = categoryCount;
    kScaleBufferCount = scaleBufferCount;

    kMatrixSize = (T_PAD + kStateCount) * kStateCount;

    int scaleBufferSize = kPaddedPatternCount;

    kFlags = 0;

    if (preferenceFlags & BEAGLE_FLAG_SCALING_AUTO || requirementFlags & BEAGLE_FLAG_SCALING_AUTO) {
        kFlags |= BEAGLE_FLAG_SCALING_AUTO;
        kFlags |= BEAGLE_FLAG_SCALERS_LOG;
        kScaleBufferCount = kInternalPartialsBufferCount;
    } else if (preferenceFlags & BEAGLE_FLAG_SCALING_ALWAYS || requirementFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
        kFlags |= BEAGLE_FLAG_SCALING_ALWAYS;
        kFlags |= BEAGLE_FLAG_SCALERS_LOG;
        kScaleBufferCount = kInternalPartialsBufferCount + 1; // +1 for temp buffer used by edgelikelihood
    } else if (preferenceFlags & BEAGLE_FLAG_SCALING_DYNAMIC || requirementFlags & BEAGLE_FLAG_SCALING_DYNAMIC) {
        kFlags |= BEAGLE_FLAG_SCALING_DYNAMIC;
        kFlags |= BEAGLE_FLAG_SCALERS_RAW;
    } else if (preferenceFlags & BEAGLE_FLAG_SCALERS_LOG || requirementFlags & BEAGLE_FLAG_SCALERS_LOG) {
        kFlags |= BEAGLE_FLAG_SCALING_MANUAL;
        kFlags |= BEAGLE_FLAG_SCALERS_LOG;
    } else {
        kFlags |= BEAGLE_FLAG_SCALING_MANUAL;
        kFlags |= BEAGLE_FLAG_SCALERS_RAW;
    }

    if (requirementFlags & BEAGLE_FLAG_EIGEN_COMPLEX || preferenceFlags & BEAGLE_FLAG_EIGEN_COMPLEX)
        kFlags |= BEAGLE_FLAG_EIGEN_COMPLEX;
    else
        kFlags |= BEAGLE_FLAG_EIGEN_REAL;

    if (requirementFlags & BEAGLE_FLAG_INVEVEC_TRANSPOSED || preferenceFlags & BEAGLE_FLAG_INVEVEC_TRANSPOSED)
        kFlags |= BEAGLE_FLAG_INVEVEC_TRANSPOSED;
    else
        kFlags |= BEAGLE_FLAG_INVEVEC_STANDARD;

    if (requirementFlags & BEAGLE_FLAG_THREADING_CPP || preferenceFlags & BEAGLE_FLAG_THREADING_CPP)
        kFlags |= BEAGLE_FLAG_THREADING_CPP;
    else
        kFlags |= BEAGLE_FLAG_THREADING_NONE;

    if (kFlags & BEAGLE_FLAG_EIGEN_COMPLEX)
        gEigenDecomposition = new EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>(kEigenDecompCount,
                kStateCount,kCategoryCount,kFlags);
    else
        gEigenDecomposition = new EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>(kEigenDecompCount,
                kStateCount, kCategoryCount,kFlags);

    gCategoryRates = (double**) calloc(sizeof(double), kEigenDecompCount);
    if (gCategoryRates == NULL)
        throw std::bad_alloc();

    gPatternWeights = (double*) malloc(sizeof(double) * kPatternCount);
    if (gPatternWeights == NULL)
        throw std::bad_alloc();

    // TODO: if pattern padding is implemented this will create problems with setTipPartials
    kPartialsSize = kPaddedPatternCount * kPartialsPaddedStateCount * kCategoryCount;

    gPartials = (REALTYPE**) malloc(sizeof(REALTYPE*) * kBufferCount);
    if (gPartials == NULL)
     throw std::bad_alloc();

    gStateFrequencies = (REALTYPE**) calloc(sizeof(REALTYPE*), kEigenDecompCount);
    if (gStateFrequencies == NULL)
        throw std::bad_alloc();

    gCategoryWeights = (REALTYPE**) calloc(sizeof(REALTYPE*), kEigenDecompCount);
    if (gCategoryWeights == NULL)
        throw std::bad_alloc();

    // assigning kBufferCount to this array so that we can just check if a tipStateBuffer is
    // allocated
    gTipStates = (int**) malloc(sizeof(int*) * kBufferCount);
    if (gTipStates == NULL)
        throw std::bad_alloc();

    for (int i = 0; i < kBufferCount; i++) {
        gPartials[i] = NULL;
        gTipStates[i] = NULL;
    }

    for (int i = kTipCount; i < kBufferCount; i++) {
        gPartials[i] = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPartialsSize);
        if (gPartials[i] == NULL)
            throw std::bad_alloc();
    }

    gScaleBuffers = NULL;

    gAutoScaleBuffers = NULL;

    if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
        gAutoScaleBuffers = (signed short**) malloc(sizeof(signed short*) * kScaleBufferCount);
        if (gAutoScaleBuffers == NULL)
            throw std::bad_alloc();
        for (int i = 0; i < kScaleBufferCount; i++) {
            gAutoScaleBuffers[i] = (signed short*) malloc(sizeof(signed short) * scaleBufferSize);
            if (gAutoScaleBuffers[i] == 0L)
                throw std::bad_alloc();
        }
        gActiveScalingFactors = (int*) malloc(sizeof(int) * kInternalPartialsBufferCount);
        gScaleBuffers = (REALTYPE**) malloc(sizeof(REALTYPE*));
        gScaleBuffers[0] = (REALTYPE*) malloc(sizeof(REALTYPE) * scaleBufferSize);
    } else {
        gScaleBuffers = (REALTYPE**) malloc(sizeof(REALTYPE*) * kScaleBufferCount);
        if (gScaleBuffers == NULL)
            throw std::bad_alloc();

        for (int i = 0; i < kScaleBufferCount; i++) {
            gScaleBuffers[i] = (REALTYPE*) malloc(sizeof(REALTYPE) * scaleBufferSize);

            if (gScaleBuffers[i] == 0L)
                throw std::bad_alloc();


            if (kFlags & BEAGLE_FLAG_SCALING_DYNAMIC) {
                for (int j=0; j < scaleBufferSize; j++) {
                    gScaleBuffers[i][j] = 1.0;
                }
            }
        }
    }


    gTransitionMatrices = (REALTYPE**) malloc(sizeof(REALTYPE*) * kMatrixCount);
    if (gTransitionMatrices == NULL)
        throw std::bad_alloc();
    for (int i = 0; i < kMatrixCount; i++) {
        gTransitionMatrices[i] = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kMatrixSize * kCategoryCount);
        if (gTransitionMatrices[i] == 0L)
            throw std::bad_alloc();
    }

    integrationTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount * kStateCount);
    firstDerivTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);
    secondDerivTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);

//    cLikelihoodTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount * kCategoryCount);
    grandDenominatorDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPaddedPatternCount); // TODO Deprecate in favor of integrationTmp
    grandNumeratorDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPaddedPatternCount);
    crossProductNumeratorTmp = nullptr;
//    grandNumeratorLowerBoundDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount);
//    grandNumeratorUpperBoundDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount);

    outLogLikelihoodsTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);
    outFirstDerivativesTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);
    outSecondDerivativesTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);

    zeros = (REALTYPE*) malloc(sizeof(REALTYPE) * kPaddedPatternCount);
    ones = (REALTYPE*) malloc(sizeof(REALTYPE) * kPaddedPatternCount);
    for(int i = 0; i < kPaddedPatternCount; i++) {
        zeros[i] = 0.0;
        ones[i] = 1.0;
    }

    kThreadingEnabled = false;
    kAutoPartitioningEnabled = false;
    if (kFlags & BEAGLE_FLAG_THREADING_CPP) {
        int hardwareThreads = std::thread::hardware_concurrency();
        if (kStateCount <= 4) {
            kMinPatternCount = BEAGLE_CPU_ASYNC_MIN_PATTERN_COUNT_LOW;
            if (hardwareThreads < BEAGLE_CPU_ASYNC_HW_THREAD_COUNT_THRESHOLD) {
                kMinPatternCount = BEAGLE_CPU_ASYNC_MIN_PATTERN_COUNT_HIGH;
            } else if (kPatternCount < BEAGLE_CPU_ASYNC_LIMIT_PATTERN_COUNT) {
                hardwareThreads = BEAGLE_CPU_ASYNC_HW_THREAD_COUNT_THRESHOLD;
            }
        } else {
            // todo: assess minimum pattern count for efficient auto-threading
            //       for higher state-count values
            kMinPatternCount = 2;
        }
        if (kPatternCount >= kMinPatternCount && hardwareThreads > 2) {
            int partitionCount = kPatternCount/(kMinPatternCount/2);
            if (partitionCount > hardwareThreads/2) {
                partitionCount = hardwareThreads/2;
            }
            int* patternPartitions = (int*) malloc(sizeof(int) * kPatternCount);
            int partitionSize = kPatternCount/partitionCount;
            for (int i=0; i<kPatternCount; i++) {
                int sitePartition = i/partitionSize;
                if (sitePartition > partitionCount - 1)
                    sitePartition = partitionCount - 1;
                patternPartitions[i] = sitePartition;
            }
            setPatternPartitions(partitionCount, patternPartitions);

            gAutoPartitionOperations = (int*) malloc(sizeof(int) * kBufferCount * kPartitionCount * BEAGLE_PARTITION_OP_COUNT);

            if (kPatternCount >= kMinPatternCount*4) {
                gAutoPartitionIndices = (int*) malloc(sizeof(int) * partitionCount);
                for (int i=0; i<partitionCount; i++) {
                    gAutoPartitionIndices[i] = i;
                }
                gAutoPartitionOutSumLogLikelihoods = (double*) malloc(sizeof(double) * partitionCount);
                kAutoRootPartitioningEnabled = false; //TODO: XJ: need to change this back to true
            }
            // TODO: XJ: need to change below back to true
            kAutoPartitioningEnabled = false;
        }
    }

    return BEAGLE_SUCCESS;
}